

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O0

int Ssw_RarManObjsAreEqual(void *pMan,Aig_Obj_t *pObj0,Aig_Obj_t *pObj1)

{
  word *pwVar1;
  word *pwVar2;
  ulong uVar3;
  int local_4c;
  int w;
  word Flip;
  word *pSim1;
  word *pSim0;
  Ssw_RarMan_t *p;
  Aig_Obj_t *pObj1_local;
  Aig_Obj_t *pObj0_local;
  void *pMan_local;
  
  pwVar1 = Ssw_RarObjSim((Ssw_RarMan_t *)pMan,pObj0->Id);
  pwVar2 = Ssw_RarObjSim((Ssw_RarMan_t *)pMan,pObj1->Id);
  uVar3 = 0;
  if (((uint)(*(ulong *)&pObj0->field_0x18 >> 3) & 1) !=
      ((uint)(*(ulong *)&pObj1->field_0x18 >> 3) & 1)) {
    uVar3 = 0xffffffffffffffff;
  }
  local_4c = 0;
  while( true ) {
    if (*(int *)(*pMan + 4) <= local_4c) {
      return 1;
    }
    if ((pwVar1[local_4c] ^ pwVar2[local_4c]) != uVar3) break;
    local_4c = local_4c + 1;
  }
  return 0;
}

Assistant:

int Ssw_RarManObjsAreEqual( void * pMan, Aig_Obj_t * pObj0, Aig_Obj_t * pObj1 )
{
    Ssw_RarMan_t * p = (Ssw_RarMan_t *)pMan;
    word * pSim0 = Ssw_RarObjSim( p, pObj0->Id );
    word * pSim1 = Ssw_RarObjSim( p, pObj1->Id );
    word Flip = (pObj0->fPhase != pObj1->fPhase) ? ~(word)0 : 0;
    int w;
    for ( w = 0; w < p->pPars->nWords; w++ )
        if ( pSim0[w] ^ pSim1[w] ^ Flip )
            return 0;
    return 1;
}